

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::VerifyMark
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this)

{
  FBVEnumerator *__return_storage_ptr__;
  HeapBlockType HVar1;
  ushort uVar2;
  BVStatic<2048UL> *this_00;
  Recycler *this_01;
  code *pcVar3;
  bool bVar4;
  BOOLEAN BVar5;
  ushort uVar6;
  BVIndex i;
  SmallHeapBlockBitVector *this_02;
  byte *pbVar7;
  uint uVar8;
  char *objectAddress;
  undefined1 local_168 [8];
  SmallHeapBlockBitVector tempFreeBits;
  FBVEnumerator _bvenum;
  undefined4 *local_40;
  
  if ((this->super_HeapBlock).needOOMRescan == false) {
    local_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_40 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x3e4,"(!this->needOOMRescan)","!this->needOOMRescan");
    if (!bVar4) {
LAB_0062737c:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *local_40 = 0;
  }
  this_00 = this->markBits;
  memset((SmallHeapBlockBitVector *)local_168,0,0x100);
  BuildFreeBitVector(this,(SmallHeapBlockBitVector *)local_168);
  this_02 = GetInvalidBitVector(this);
  uVar2 = this->objectSize;
  this_01 = this->heapBucket->heapInfo->recycler;
  __return_storage_ptr__ = (FBVEnumerator *)(tempFreeBits.data + 0x1f);
  BVStatic<2048UL>::BeginSetBits(__return_storage_ptr__,this_00);
  do {
    bVar4 = JsUtil::FBVEnumerator::End(__return_storage_ptr__);
    if (bVar4) {
      return;
    }
    i = JsUtil::FBVEnumerator::GetCurrent(__return_storage_ptr__);
    BVar5 = BVStatic<2048UL>::Test((BVStatic<2048UL> *)local_168,i);
    if (BVar5 == '\0') {
      BVar5 = BVStatic<2048UL>::Test(this_02,i);
      if (BVar5 == '\0') {
        bVar4 = IsValidBitIndex(this,i);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_40 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                             ,0x3f2,"(IsValidBitIndex(bitIndex))","IsValidBitIndex(bitIndex)");
          if (!bVar4) goto LAB_0062737c;
          *local_40 = 0;
        }
        uVar6 = GetObjectIndexFromBitIndex(this,(ushort)i);
        pbVar7 = ObjectInfo(this,(uint)uVar6);
        if ((*pbVar7 & 4) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_40 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                             ,0x3f5,"((this->ObjectInfo(objectIndex) & NewTrackBit) == 0)",
                             "(this->ObjectInfo(objectIndex) & NewTrackBit) == 0");
          if (!bVar4) goto LAB_0062737c;
          *local_40 = 0;
        }
        HVar1 = (this->super_HeapBlock).heapBlockType;
        if ((HVar1 != SmallLeafBlockType) && (HVar1 != MediumLeafBlockType)) {
          bVar4 = IsWithBarrier(this);
          if ((!bVar4) || (DAT_0145c43e == '\x01')) {
            pbVar7 = ObjectInfo(this,(uint)uVar6);
            if ((*pbVar7 & 0x20) == 0) {
              objectAddress = (this->super_HeapBlock).address + (uint)this->objectSize * (uint)uVar6
              ;
              uVar8 = (uint)(uVar2 >> 3);
              while (bVar4 = uVar8 != 0, uVar8 = uVar8 - 1, bVar4) {
                bVar4 = Recycler::VerifyMark(this_01,objectAddress,*(void **)objectAddress);
                if (((bVar4) && (DAT_0145c43e == '\x01')) && (DAT_0145c43f == '\x01')) {
                  (*(this->super_HeapBlock)._vptr_HeapBlock[3])(this);
                }
                objectAddress = objectAddress + 8;
              }
            }
          }
        }
      }
    }
    JsUtil::FBVEnumerator::operator++(__return_storage_ptr__,0);
  } while( true );
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::VerifyMark()
{
    Assert(!this->needOOMRescan);

    SmallHeapBlockBitVector * marked = this->GetMarkedBitVector();
    SmallHeapBlockBitVector tempFreeBits;
    this->BuildFreeBitVector(&tempFreeBits);
    SmallHeapBlockBitVector * free = &tempFreeBits;
    SmallHeapBlockBitVector const * invalid = this->GetInvalidBitVector();
    uint objectWordCount = this->GetObjectWordCount();
    Recycler * recycler = this->heapBucket->heapInfo->recycler;

    FOREACH_BITSET_IN_FIXEDBV(bitIndex, marked)
    {
        if (!free->Test(bitIndex) && !invalid->Test(bitIndex))
        {
            Assert(IsValidBitIndex(bitIndex));
            uint objectIndex = GetObjectIndexFromBitIndex((ushort)bitIndex);

            Assert((this->ObjectInfo(objectIndex) & NewTrackBit) == 0);

            // NOTE: We can't verify mark for software write barrier blocks, because they may have
            // non-pointer updates that don't trigger the write barrier, but still look like a false reference.
            // Thus, when we get here, we'll see a false reference that isn't marked.
            // Since this situation is hard to detect, just don't verify mark for write barrier blocks.
            // We could fix this if we had object layout info.

            if (!this->IsLeafBlock()
#ifdef RECYCLER_WRITE_BARRIER
                && (!this->IsWithBarrier() || CONFIG_FLAG(ForceSoftwareWriteBarrier))
#endif
                )
            {
                if ((ObjectInfo(objectIndex) & LeafBit) == 0)
                {
                    char * objectAddress = this->address + objectIndex * objectSize;
                    for (uint i = 0; i < objectWordCount; i++)
                    {
                        void* target = *(void**) objectAddress;
                        if (recycler->VerifyMark(objectAddress, target))
                        {
#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
                            if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(VerifyBarrierBit))
                            {
                                this->WBVerifyBitIsSet(objectAddress);
                            }
#endif
                        }

                        objectAddress += sizeof(void *);
                    }
                }
            }
        }
    }
    NEXT_BITSET_IN_FIXEDBV;
}